

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

uint8_t * bcf_unpack_fmt_core1(uint8_t *ptr,int n_sample,bcf_fmt_t *fmt)

{
  int32_t iVar1;
  int iVar2;
  uint32_t uVar3;
  uint8_t *local_28;
  
  local_28 = ptr;
  iVar1 = bcf_dec_typed_int1(ptr,&local_28);
  fmt->id = iVar1;
  iVar1 = bcf_dec_size(local_28,&local_28,&fmt->type);
  fmt->n = iVar1;
  iVar2 = iVar1 << (bcf_type_shift[fmt->type] & 0x1f);
  fmt->size = iVar2;
  fmt->p = local_28;
  *(uint *)&fmt->field_0x1c = (int)local_28 - (int)ptr & 0x7fffffff;
  uVar3 = iVar2 * n_sample;
  fmt->p_len = uVar3;
  return local_28 + (int)uVar3;
}

Assistant:

static inline uint8_t *bcf_unpack_fmt_core1(uint8_t *ptr, int n_sample, bcf_fmt_t *fmt)
{
    uint8_t *ptr_start = ptr;
    fmt->id = bcf_dec_typed_int1(ptr, &ptr);
    fmt->n = bcf_dec_size(ptr, &ptr, &fmt->type);
    fmt->size = fmt->n << bcf_type_shift[fmt->type];
    fmt->p = ptr;
    fmt->p_off  = ptr - ptr_start;
    fmt->p_free = 0;
    ptr += n_sample * fmt->size;
    fmt->p_len = ptr - fmt->p;
    return ptr;
}